

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O3

void __thiscall Fl_Graphics_Driver::circle(Fl_Graphics_Driver *this,double x,double y,double r)

{
  double dVar1;
  code *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar3 = (this->m).a;
  dVar7 = (this->m).b;
  dVar4 = (this->m).c;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar6 = SQRT(dVar3 * dVar3 + dVar4 * dVar4);
  }
  else {
    dVar6 = ABS(dVar3);
  }
  dVar5 = (this->m).d;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar1 = SQRT(dVar7 * dVar7 + dVar5 * dVar5);
  }
  else {
    dVar1 = ABS(dVar5);
  }
  dVar5 = (this->m).y + dVar7 * x + dVar5 * y;
  dVar7 = (this->m).x + dVar3 * x + dVar4 * y;
  dVar3 = rint(dVar7 - dVar6 * r);
  dVar7 = rint(dVar6 * r + dVar7);
  dVar4 = rint(dVar5 - dVar1 * r);
  dVar6 = rint(dVar1 * r + dVar5);
  if (this->what == 2) {
    pcVar2 = XFillArc;
  }
  else {
    pcVar2 = XDrawArc;
  }
  (*pcVar2)(fl_display,fl_window,fl_gc,(int)dVar3,(int)dVar4,(int)dVar7 - (int)dVar3,
            (int)dVar6 - (int)dVar4,0,0x5a00);
  return;
}

Assistant:

void Fl_Graphics_Driver::circle(double x, double y,double r) {
  double xt = transform_x(x,y);
  double yt = transform_y(x,y);
  double rx = r * (m.c ? sqrt(m.a*m.a+m.c*m.c) : fabs(m.a));
  double ry = r * (m.b ? sqrt(m.b*m.b+m.d*m.d) : fabs(m.d));
  int llx = (int)rint(xt-rx);
  int w = (int)rint(xt+rx)-llx;
  int lly = (int)rint(yt-ry);
  int h = (int)rint(yt+ry)-lly;

#if defined(USE_X11)
  (what == POLYGON ? XFillArc : XDrawArc)
    (fl_display, fl_window, fl_gc, llx, lly, w, h, 0, 360*64);
#elif defined(WIN32)
  if (what==POLYGON) {
    SelectObject(fl_gc, fl_brush());
    Pie(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
  } else
    Arc(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
#elif defined(__APPLE_QUARTZ__)
  // Quartz warning: circle won't scale to current matrix!
  // Last argument must be 0 (counter-clockwise) or it draws nothing under __LP64__ !!!!
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextAddArc(fl_gc, xt, yt, (w+h)*0.25f, 0, 2.0f*M_PI, 0);
  (what == POLYGON ? CGContextFillPath : CGContextStrokePath)(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}